

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fl_rect.cxx
# Opt level: O1

void __thiscall Fl_Graphics_Driver::yxline(Fl_Graphics_Driver *this,int x,int y,int y1)

{
  int iVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  
  iVar4 = 1;
  if (1 < fl_line_width_) {
    iVar4 = fl_line_width_;
  }
  iVar3 = 0x7fff - iVar4;
  iVar4 = -iVar4;
  iVar1 = x;
  if (iVar3 < x) {
    iVar1 = iVar3;
  }
  if (x < iVar4) {
    iVar1 = iVar4;
  }
  iVar2 = y;
  if (iVar3 < y) {
    iVar2 = iVar3;
  }
  if (y < iVar4) {
    iVar2 = iVar4;
  }
  if (y1 <= iVar3) {
    iVar3 = y1;
  }
  if (y1 < iVar4) {
    iVar3 = iVar4;
  }
  XDrawLine(fl_display,fl_window,fl_gc,iVar1,iVar2,iVar1,iVar3);
  return;
}

Assistant:

void Fl_Graphics_Driver::yxline(int x, int y, int y1) {
#if defined(USE_X11)
  XDrawLine(fl_display, fl_window, fl_gc, clip_x(x), clip_x(y), clip_x(x), clip_x(y1));
#elif defined(WIN32)
  if (y1 < y) y1--;
  else y1++;
  MoveToEx(fl_gc, x, y, 0L); LineTo(fl_gc, x, y1);
#elif defined(__APPLE_QUARTZ__)
  if (USINGQUARTZPRINTER || fl_quartz_line_width_ > 1.5f) CGContextSetShouldAntialias(fl_gc, true);
  CGContextMoveToPoint(fl_gc, x, y);
  CGContextAddLineToPoint(fl_gc, x, y1);
  CGContextStrokePath(fl_gc);
  if (Fl_Display_Device::high_resolution()) {
    CGContextFillRect(fl_gc, CGRectMake(x  -  fl_quartz_line_width_/2, y-0.5, fl_quartz_line_width_, 1));
    CGContextFillRect(fl_gc, CGRectMake(x  -  fl_quartz_line_width_/2, y1-0.5, fl_quartz_line_width_, 1));
  }
  if (USINGQUARTZPRINTER || fl_quartz_line_width_ > 1.5f) CGContextSetShouldAntialias(fl_gc, false);
#else
# error unsupported platform
#endif
}